

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t isint_w(wchar_t *start,wchar_t *end,wchar_t *result)

{
  wchar_t wVar1;
  wchar_t in_EAX;
  wchar_t wVar2;
  
  if (start < end) {
    in_EAX = L'\0';
    for (; start < end; start = start + 1) {
      wVar1 = *start;
      if ((uint)(wVar1 + L'\xffffffc6') < 0xfffffff6) {
        return in_EAX;
      }
      wVar2 = L'\x7fffffff';
      if ((in_EAX < L'\x0ccccccd') && (in_EAX != L'\x0ccccccc' || (uint)wVar1 < 0x38)) {
        wVar2 = in_EAX * 10 + wVar1 + L'\xffffffd0';
      }
      in_EAX = wVar2;
    }
    *result = in_EAX;
  }
  return in_EAX;
}

Assistant:

static int
isint_w(const wchar_t *start, const wchar_t *end, int *result)
{
	int n = 0;
	if (start >= end)
		return (0);
	while (start < end) {
		if (*start < '0' || *start > '9')
			return (0);
		if (n > (INT_MAX / 10) ||
		    (n == INT_MAX / 10 && (*start - '0') > INT_MAX % 10)) {
			n = INT_MAX;
		} else {
			n *= 10;
			n += *start - '0';
		}
		start++;
	}
	*result = n;
	return (1);
}